

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O3

MPP_RET release_task_in_port(MppPort port)

{
  MPP_RET MVar1;
  MppTask mpp_task;
  MppFrame frame;
  MppPacket packet;
  MppTask local_48;
  MppFrame local_40;
  MppPacket local_38;
  
  local_38 = (MppPacket)0x0;
  local_40 = (MppFrame)0x0;
  MVar1 = _mpp_port_poll("release_task_in_port",port,MPP_POLL_NON_BLOCK);
  if (MPP_NOK < MVar1) {
    do {
      _mpp_port_dequeue("release_task_in_port",port,&local_48);
      if (local_48 == (MppTask)0x0) {
        _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"mpp_task",
                   "release_task_in_port",0xa2);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
        if (local_48 == (MppTask)0x0) {
          return 0x2fbaa0;
        }
      }
      local_38 = (MppPacket)0x0;
      local_40 = (MppFrame)0x0;
      mpp_task_meta_get_frame(local_48,KEY_INPUT_FRAME,&local_40);
      if (local_40 != (MppFrame)0x0) {
        mpp_frame_deinit(&local_40);
        local_40 = (MppFrame)0x0;
      }
      mpp_task_meta_get_packet(local_48,KEY_OUTPUT_PACKET,&local_38);
      if (local_38 != (MppPacket)0x0) {
        mpp_packet_deinit(&local_38);
        local_38 = (MppPacket)0x0;
      }
      _mpp_port_enqueue("release_task_in_port",port,local_48);
      local_48 = (MppTask)0x0;
      MVar1 = _mpp_port_poll("release_task_in_port",port,MPP_POLL_NON_BLOCK);
    } while (MPP_NOK < MVar1);
  }
  return MVar1;
}

Assistant:

static MPP_RET release_task_in_port(MppPort port)
{
    MPP_RET ret = MPP_OK;
    MppPacket packet = NULL;
    MppFrame frame = NULL;
    MppTask mpp_task;

    do {
        ret = mpp_port_poll(port, MPP_POLL_NON_BLOCK);
        if (ret < 0)
            break;

        mpp_port_dequeue(port, &mpp_task);
        mpp_assert(mpp_task);
        if (mpp_task) {
            packet = NULL;
            frame = NULL;
            ret = mpp_task_meta_get_frame(mpp_task, KEY_INPUT_FRAME,  &frame);
            if (frame) {
                mpp_frame_deinit(&frame);
                frame = NULL;
            }
            ret = mpp_task_meta_get_packet(mpp_task, KEY_OUTPUT_PACKET, &packet);
            if (packet) {
                mpp_packet_deinit(&packet);
                packet = NULL;
            }

            mpp_port_enqueue(port, mpp_task);
            mpp_task = NULL;
        } else
            break;
    } while (1);

    return ret;
}